

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codewriter.cpp
# Opt level: O3

bool asmjit::v1_14::CodeWriterUtils::writeOffset(void *dst,int64_t offset64,OffsetFormat *format)

{
  bool bVar1;
  ulong in_RAX;
  ulong uVar2;
  uint32_t mask;
  ulong local_18;
  
  bVar1 = false;
  if (format->_valueSize - 1 < 8) {
    uVar2 = (ulong)format->_valueOffset;
    bVar1 = false;
    local_18 = in_RAX;
    switch((uint)format->_valueSize) {
    case 1:
      bVar1 = encodeOffset32((uint32_t *)&local_18,offset64,format);
      if (bVar1) {
        *(byte *)((long)dst + uVar2) = *(byte *)((long)dst + uVar2) | (byte)local_18;
      }
      break;
    case 2:
      bVar1 = encodeOffset32((uint32_t *)&local_18,offset64,format);
      if (bVar1) {
        *(ushort *)((long)dst + uVar2) = *(ushort *)((long)dst + uVar2) | (ushort)local_18;
      }
      break;
    case 4:
      bVar1 = encodeOffset32((uint32_t *)&local_18,offset64,format);
      if (bVar1) {
        *(uint *)((long)dst + uVar2) = *(uint *)((long)dst + uVar2) | (uint)local_18;
      }
      break;
    case 8:
      bVar1 = encodeOffset64(&local_18,offset64,format);
      if (bVar1) {
        *(ulong *)((long)dst + uVar2) = *(ulong *)((long)dst + uVar2) | local_18;
      }
    }
  }
  return bVar1;
}

Assistant:

bool CodeWriterUtils::writeOffset(void* dst, int64_t offset64, const OffsetFormat& format) noexcept {
  // Offset the destination by ValueOffset so the `dst` points to the
  // patched word instead of the beginning of the patched region.
  dst = static_cast<char*>(dst) + format.valueOffset();

  switch (format.valueSize()) {
    case 1: {
      uint32_t mask;
      if (!encodeOffset32(&mask, offset64, format))
        return false;

      Support::writeU8(dst, uint8_t(Support::readU8(dst) | mask));
      return true;
    }

    case 2: {
      uint32_t mask;
      if (!encodeOffset32(&mask, offset64, format))
        return false;

      Support::writeU16uLE(dst, uint16_t(Support::readU16uLE(dst) | mask));
      return true;
    }

    case 4: {
      uint32_t mask;
      if (!encodeOffset32(&mask, offset64, format)) {
        return false;
      }

      Support::writeU32uLE(dst, Support::readU32uLE(dst) | mask);
      return true;
    }

    case 8: {
      uint64_t mask;
      if (!encodeOffset64(&mask, offset64, format))
        return false;

      Support::writeU64uLE(dst, Support::readU64uLE(dst) | mask);
      return true;
    }

    default:
      return false;
  }
}